

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O0

void __thiscall hwnet::sendContextPool::put(sendContextPool *this,sendContext *s)

{
  lock_guard<std::mutex> local_30;
  lock_guard<std::mutex> guard;
  pool *p;
  int index;
  sendContext *s_local;
  sendContextPool *this_local;
  
  guard._M_device = &this->pools[s->poolIndex].mtx;
  std::lock_guard<std::mutex>::lock_guard(&local_30,guard._M_device);
  TCPSocket::sendContext::~sendContext(s);
  if (guard._M_device[1].super___mutex_base._M_mutex.__data.__lock < 10000) {
    guard._M_device[1].super___mutex_base._M_mutex.__data.__lock =
         guard._M_device[1].super___mutex_base._M_mutex.__data.__lock + 1;
    if (*(long *)((long)&guard._M_device[1].super___mutex_base._M_mutex + 8) != 0) {
      s->next = *(sendContext **)
                 (*(long *)((long)&guard._M_device[1].super___mutex_base._M_mutex + 8) + 0x20);
    }
    *(sendContext **)((long)&guard._M_device[1].super___mutex_base._M_mutex + 8) = s;
  }
  else {
    free(s);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_30);
  return;
}

Assistant:

void put(TCPSocket::sendContext *s) {
		auto index = s->poolIndex;
		pool &p = this->pools[index]; 
		std::lock_guard<std::mutex> guard(p.mtx);
		s->~sendContext();		
		if(p.count < itemCount){
			p.count++;
			if(nullptr != p.head){
				s->next = p.head->next;
			}
			p.head = s;
		} else {
			free((void*)s);
		}
	}